

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::DateFormatSymbols
          (DateFormatSymbols *this,Locale *locale,UErrorCode *status)

{
  UErrorCode *status_local;
  Locale *locale_local;
  DateFormatSymbols *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)0x0;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateFormatSymbols_005bd308;
  icu_63::UnicodeString::UnicodeString(&this->fTimeSeparator);
  Locale::Locale(&this->fZSFLocale);
  icu_63::UnicodeString::UnicodeString(&this->fLocalPatternChars);
  initializeData(this,locale,(char *)0x0,status,'\0');
  return;
}

Assistant:

DateFormatSymbols::DateFormatSymbols(const Locale& locale,
                                     UErrorCode& status)
    : UObject()
{
  initializeData(locale, NULL,  status);
}